

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.c
# Opt level: O2

void do_hit(CHAR_DATA *ch,char *argument)

{
  CHAR_DATA *pCVar1;
  char *txt;
  char arg [4608];
  char local_1208 [4608];
  
  one_argument(argument,local_1208);
  if (ch->position == 7) {
    if (local_1208[0] == '\0') {
      txt = "Switch targets to whom?\n\r";
    }
    else {
      pCVar1 = get_char_room(ch,local_1208);
      if (pCVar1 == (CHAR_DATA *)0x0) {
        txt = "They aren\'t here.\n\r";
      }
      else if (pCVar1 == ch) {
        txt = "Are you crazy?\n\r";
      }
      else if (pCVar1->fighting == ch) {
        if (pCVar1 != ch->fighting) {
          ch->fighting = pCVar1;
          ch->batter = 0;
          return;
        }
        txt = "You\'re trying as hard as you can!\n\r";
      }
      else {
        txt = "That person isn\'t fighting you.\n\r";
      }
    }
  }
  else {
    txt = "You\'re not fighting anyone.\n\r";
  }
  send_to_char(txt,ch);
  return;
}

Assistant:

void do_hit(CHAR_DATA *ch, char *argument)
{
	char arg[MAX_INPUT_LENGTH];
	CHAR_DATA *victim;

	one_argument(argument, arg);

	if (ch->position != POS_FIGHTING)
	{
		send_to_char("You're not fighting anyone.\n\r", ch);
		return;
	}

	if (arg[0] == '\0')
	{
		send_to_char("Switch targets to whom?\n\r", ch);
		return;
	}

	victim = get_char_room(ch, arg);

	if (victim == nullptr)
	{
		send_to_char("They aren't here.\n\r", ch);
		return;
	}

	if (victim == ch)
	{
		send_to_char("Are you crazy?\n\r", ch);
		return;
	}

	if (victim->fighting != ch)
	{
		send_to_char("That person isn't fighting you.\n\r", ch);
		return;
	}

	if (victim == ch->fighting)
	{
		send_to_char("You're trying as hard as you can!\n\r", ch);
		return;
	}

	ch->fighting = victim;
	ch->batter = 0;
}